

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  rle16_t *prVar1;
  bool bVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  run_container_t *prVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  long lVar12;
  int size;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar6 = (run_container_t *)c;
  if (iVar5 == 2) {
    iVar5 = *c;
    lVar14 = (long)iVar5;
    if (lVar14 == 0) {
      size = 0;
    }
    else {
      lVar9 = 0;
      uVar13 = 0xfffffffe;
      size = 0;
      do {
        uVar10 = uVar13 + 1;
        uVar13 = (uint)*(ushort *)(*(long *)((long)c + 8) + lVar9);
        size = size + (uint)(uVar10 != uVar13);
        lVar9 = lVar9 + 2;
      } while (lVar14 * 2 != lVar9);
    }
    if (SBORROW4(size * 4,iVar5 * 2) == size * 4 + iVar5 * -2 < 0) {
      *typecode_after = '\x02';
    }
    else {
      prVar6 = run_container_create_given_capacity(size);
      if (iVar5 < 1) {
        uVar4 = 0xfffe;
        uVar13 = 0xffffffff;
      }
      else {
        lVar9 = *(long *)((long)c + 8);
        uVar13 = 0xffffffff;
        uVar10 = 0xfffffffe;
        lVar12 = 0;
        do {
          uVar4 = *(ushort *)(lVar9 + lVar12 * 2);
          uVar3 = uVar13;
          if ((uVar10 + 1 != (uint)uVar4) && (uVar3 = (uint)uVar4, uVar13 != 0xffffffff)) {
            prVar1 = prVar6->runs;
            iVar5 = prVar6->n_runs;
            prVar1[iVar5].value = (uint16_t)uVar13;
            prVar1[iVar5].length = (short)uVar10 - (uint16_t)uVar13;
            prVar6->n_runs = iVar5 + 1;
          }
          uVar13 = uVar3;
          uVar4 = *(ushort *)(lVar9 + lVar12 * 2);
          uVar10 = (uint)uVar4;
          lVar12 = lVar12 + 1;
        } while (lVar14 != lVar12);
      }
      prVar1 = prVar6->runs;
      iVar5 = prVar6->n_runs;
      prVar1[iVar5].value = (uint16_t)uVar13;
      prVar1[iVar5].length = uVar4 - (uint16_t)uVar13;
      prVar6->n_runs = iVar5 + 1;
      *typecode_after = '\x03';
      (*global_memory_hook.free)(*(void **)((long)c + 8));
      (*global_memory_hook.free)(c);
    }
  }
  else if (iVar5 == 3) {
    prVar6 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar6 != (run_container_t *)c) {
      container_free(c,typecode_original);
    }
  }
  else {
    iVar5 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar5 * 4 + 2 < 0x2000) {
      prVar6 = run_container_create_given_capacity(iVar5);
      uVar15 = **(ulong **)((long)c + 8);
      uVar7 = 0;
      do {
        bVar16 = uVar15 == 0;
        if ((bVar16) && ((int)uVar7 < 0x3ff)) {
          uVar8 = (long)(int)uVar7;
          do {
            uVar7 = uVar8 + 1;
            uVar15 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar8 * 8);
            bVar16 = uVar15 == 0;
            if (!bVar16) break;
            bVar2 = (long)uVar8 < 0x3fe;
            uVar8 = uVar7;
          } while (bVar2);
        }
        else {
          uVar7 = uVar7 & 0xffffffff;
        }
        if (bVar16) {
          if (c != (container_t *)0x0) {
            (*global_memory_hook.aligned_free)(*(void **)((long)c + 8));
            (*global_memory_hook.free)(c);
          }
          *typecode_after = '\x03';
          return prVar6;
        }
        uVar8 = uVar15 - 1 | uVar15;
        bVar16 = uVar8 == 0xffffffffffffffff;
        iVar5 = (int)uVar7;
        uVar7 = uVar7 & 0xffffffff;
        if ((bVar16) && (iVar5 < 0x3ff)) {
          uVar11 = (long)iVar5;
          do {
            uVar7 = uVar11 + 1;
            uVar8 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar11 * 8);
            bVar16 = uVar8 == 0xffffffffffffffff;
            if (!bVar16) break;
            bVar2 = (long)uVar11 < 0x3fe;
            uVar11 = uVar7;
          } while (bVar2);
        }
        lVar14 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar4 = (ushort)(iVar5 << 6) | (ushort)lVar14;
        if (bVar16) {
          iVar5 = prVar6->n_runs;
          prVar1 = prVar6->runs;
          prVar1[iVar5].value = uVar4;
          prVar1[iVar5].length = ((short)uVar7 * 0x40 - uVar4) + 0x3f;
          prVar6->n_runs = iVar5 + 1;
          if (c != (container_t *)0x0) {
            (*global_memory_hook.aligned_free)(*(void **)((long)c + 8));
            (*global_memory_hook.free)(c);
          }
          *typecode_after = '\x03';
        }
        else {
          lVar14 = 0;
          if (~uVar8 != 0) {
            for (; (~uVar8 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          prVar1 = prVar6->runs;
          iVar5 = prVar6->n_runs;
          prVar1[iVar5].value = uVar4;
          prVar1[iVar5].length = ~uVar4 + (short)((int)uVar7 << 6) + (short)lVar14;
          prVar6->n_runs = iVar5 + 1;
          uVar15 = uVar8 + 1 & uVar8;
        }
      } while (!bVar16);
    }
    else {
      *typecode_after = '\x01';
    }
  }
  return prVar6;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}